

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
pbrt::
returnArray<unsigned_char,pstd::vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>>,bool(*)(unsigned_char_const*,pbrt::FileLoc_const*)>
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *values,
          ParsedParameter *param,int nPerItem,_func_bool_uchar_ptr_FileLoc_ptr *convert)

{
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  allocator_type *paVar4;
  const_reference pvVar5;
  byte *pbVar6;
  int in_ECX;
  long in_RDX;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  code *in_R8;
  size_t i;
  size_t n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  undefined1 *__n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  FileLoc *in_stack_ffffffffffffffd0;
  allocator_type *paVar7;
  
  this = in_RDI;
  bVar1 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                     0x72f819);
  if (bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
  }
  sVar3 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::size
                    (in_RSI);
  if (sVar3 % (ulong)(long)in_ECX == 0) {
    *(undefined1 *)(in_RDX + 0xd8) = 1;
    sVar3 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::size
                      (in_RSI);
    paVar4 = (allocator_type *)(sVar3 / (ulong)(long)in_ECX);
    __n = &stack0xffffffffffffffce;
    paVar7 = paVar4;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x72f8bd);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this,(size_type)__n,paVar4);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x72f8dd);
    for (paVar4 = (allocator_type *)0x0; paVar4 < paVar7; paVar4 = paVar4 + 1) {
      pvVar5 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
               operator[](in_RSI,(long)in_ECX * (long)paVar4);
      bVar2 = (*in_R8)(pvVar5,in_RDX + 0x40);
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (this,(size_type)paVar4);
      *pbVar6 = bVar2 & 1;
    }
    return in_RDI;
  }
  ErrorExit<std::__cxx11::string_const&,int&>
            (in_stack_ffffffffffffffd0,
             (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
}

Assistant:

static std::vector<ReturnType> returnArray(const ValuesType &values,
                                           const ParsedParameter &param, int nPerItem,
                                           C convert) {
    if (values.empty())
        ErrorExit(&param.loc, "No values provided for \"%s\".", param.name);
    if (values.size() % nPerItem)
        ErrorExit(&param.loc, "Number of values provided for \"%s\" not a multiple of %d",
                  param.name, nPerItem);

    param.lookedUp = true;
    size_t n = values.size() / nPerItem;
    std::vector<ReturnType> v(n);
    for (size_t i = 0; i < n; ++i)
        v[i] = convert(&values[nPerItem * i], &param.loc);
    return v;
}